

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O0

void ncnn::resize_bilinear_font(uchar *font_bitmap,uchar *resized_font_bitmap,int fontpixelsize)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  int *piVar29;
  byte *pbVar30;
  byte *pbVar31;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  short s1_1;
  short s0_1;
  __m128i _Dp_1;
  __m128i _acc;
  __m128i _r1_1;
  __m128i _r0_1;
  __m128i _Dp;
  __m128i _acc1_1;
  __m128i _acc0_1;
  __m128i _r11_1;
  __m128i _r10_1;
  __m128i _r01_1;
  __m128i _r00_1;
  __m128i _v2_1;
  __m128i _b1_1;
  __m128i _b0_1;
  int dx_7;
  uchar *Dp;
  short *rows1p_6;
  short *rows0p_3;
  short b1_2;
  short b0_2;
  short s1;
  short s0;
  __m128i _Dp1_1;
  __m128i _Dp0_1;
  __m128i _acc1;
  __m128i _acc0;
  __m128i _r1;
  __m128i _r0;
  __m128i _Dp1;
  __m128i _Dp0;
  __m128i _acc11;
  __m128i _acc10;
  __m128i _acc01;
  __m128i _acc00;
  __m128i _r11;
  __m128i _r10;
  __m128i _r01;
  __m128i _r00;
  __m128i _v2;
  __m128i _b3;
  __m128i _b2;
  __m128i _b1;
  __m128i _b0;
  int dx_6;
  uchar *Dp1;
  uchar *Dp0;
  short *rows1p_5;
  short *rows0p_2;
  short b3;
  short b2;
  short b1_1;
  short b0_1;
  uchar S1p1_1;
  uchar S1p0_1;
  uchar S0p1_1;
  uchar S0p0_1;
  short a1_3;
  short a0_3;
  int dx_5;
  short *rows1p_4;
  short *rows0p_1;
  short *ialphap_2;
  uchar S0p1;
  uchar S0p0;
  short a1_2;
  short a0_2;
  int dx_4;
  short *rows1p_3;
  short *rows0p;
  short *ialphap_1;
  uchar *S1_1;
  uchar *S0;
  uchar S1p1;
  uchar S1p0;
  short a1_1;
  short a0_1;
  int dx_3;
  short *rows1p_2;
  short *ialphap;
  int dx_2;
  short *rows1p_1;
  uchar *S1;
  short *rows0_old;
  int dy_1;
  int prev_sy1;
  int dx_1;
  short *rows1p;
  short *rows1;
  short *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  float b1;
  float b0;
  int dy;
  float a1;
  float a0;
  int dx;
  int sy;
  int sx;
  float fy;
  float fx;
  short *ibeta;
  short *ialpha;
  int *yofs;
  int *xofs;
  int *buf;
  double scale;
  int h;
  int w;
  int srch;
  int srcw;
  int INTER_RESIZE_COEF_SCALE;
  int INTER_RESIZE_COEF_BITS;
  Allocator *in_stack_ffffffffffffebf8;
  undefined1 (**ppauVar37) [16];
  size_t in_stack_ffffffffffffec00;
  undefined1 in_stack_ffffffffffffec0c;
  undefined1 in_stack_ffffffffffffec0d;
  undefined1 in_stack_ffffffffffffec0e;
  undefined1 in_stack_ffffffffffffec0f;
  undefined1 in_stack_ffffffffffffec10;
  undefined1 in_stack_ffffffffffffec11;
  undefined1 in_stack_ffffffffffffec12;
  undefined1 in_stack_ffffffffffffec13;
  undefined1 in_stack_ffffffffffffec14;
  undefined1 in_stack_ffffffffffffec15;
  undefined1 in_stack_ffffffffffffec16;
  undefined1 in_stack_ffffffffffffec17;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  byte local_eec;
  byte local_ed4;
  byte local_ebc;
  byte local_ea4;
  byte local_e8c;
  byte local_e74;
  byte local_e5c;
  byte local_e44;
  int local_d2c;
  undefined8 *local_d28;
  undefined1 (*local_d20) [16];
  undefined1 (*local_d18) [16];
  int local_bb4;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined1 (*local_ba0) [16];
  undefined1 (*local_b98) [16];
  byte local_b84;
  byte local_b83;
  byte local_b82;
  byte local_b81;
  int local_b7c;
  short *local_b68;
  byte local_b5a;
  byte local_b59;
  int local_b54;
  short *local_b40;
  byte local_b22;
  byte local_b21;
  int local_b1c;
  short *local_b10;
  int local_b04;
  int local_ae4;
  int local_ae0;
  int local_adc;
  undefined1 (*local_ad0) [16];
  undefined1 (*local_ac8) [16];
  undefined1 (*local_ab0) [16];
  int *local_aa8;
  undefined8 local_aa0;
  undefined4 local_a98;
  long *local_a90;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined8 local_a70;
  undefined1 (*local_a68) [16];
  int *local_a60;
  undefined8 local_a58;
  undefined4 local_a50;
  long *local_a48;
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined8 local_a28;
  int local_a20 [3];
  int local_a14 [3];
  float local_a08;
  float local_a04;
  int local_a00;
  int local_9fc [3];
  int local_9f0 [3];
  float local_9e4;
  float local_9e0;
  int local_9dc;
  int local_9d8;
  int local_9d4;
  float local_9d0;
  float local_9cc;
  short *local_9c8;
  short *local_9c0;
  void *local_9b8;
  void *local_9b0;
  void *local_9a8;
  double local_9a0;
  int local_994;
  int local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  long local_978;
  long local_970;
  undefined8 local_968;
  undefined8 local_960;
  int local_954;
  undefined1 (**local_950) [16];
  undefined8 local_948;
  undefined8 local_940;
  int local_934;
  undefined1 (**local_930) [16];
  undefined1 (**local_928) [16];
  undefined1 (**local_920) [16];
  undefined2 local_918;
  short local_916;
  short local_914;
  undefined2 local_912;
  short local_910;
  short local_90e;
  short local_90c;
  short local_90a;
  undefined1 (*local_908) [16];
  undefined1 (*local_900) [16];
  undefined1 (*local_8f8) [16];
  undefined1 (*local_8f0) [16];
  undefined1 (*local_8e8) [16];
  undefined1 (*local_8e0) [16];
  undefined1 (*local_8d8) [16];
  undefined1 (*local_8d0) [16];
  undefined1 (*local_8c8) [16];
  undefined1 (*local_8c0) [16];
  undefined1 (*local_8b8) [16];
  undefined1 (*local_8b0) [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 local_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined4 local_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined4 local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined4 local_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined4 local_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined4 local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined4 local_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  undefined1 (**local_188) [16];
  undefined1 (**local_178) [16];
  undefined8 local_168;
  undefined8 uStack_160;
  short local_158;
  short local_156;
  short local_154;
  short local_152;
  short local_150;
  short local_14e;
  short local_14c;
  short local_14a;
  undefined8 local_148;
  undefined8 uStack_140;
  short local_138;
  short local_136;
  short local_134;
  short local_132;
  short local_130;
  short local_12e;
  short local_12c;
  short local_12a;
  undefined8 local_128;
  undefined8 uStack_120;
  short local_118;
  short local_116;
  short local_114;
  short local_112;
  short local_110;
  short local_10e;
  short local_10c;
  short local_10a;
  undefined8 local_108;
  undefined8 uStack_100;
  short local_f8;
  short local_f6;
  short local_f4;
  short local_f2;
  short local_f0;
  short local_ee;
  short local_ec;
  short local_ea;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined2 local_d8;
  undefined2 local_d6;
  undefined2 local_d4;
  undefined2 local_d2;
  undefined2 local_d0;
  undefined2 local_ce;
  undefined2 local_cc;
  undefined2 local_ca;
  undefined8 local_c8;
  undefined8 uStack_c0;
  short local_b8;
  short local_b6;
  short local_b4;
  short local_b2;
  short local_b0;
  short local_ae;
  short local_ac;
  short local_aa;
  undefined8 local_a8;
  undefined8 uStack_a0;
  short local_98;
  short local_96;
  short local_94;
  short local_92;
  short local_90;
  short local_8e;
  short local_8c;
  short local_8a;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined2 local_68;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  int local_50;
  undefined4 local_4c;
  undefined1 (**local_48) [16];
  int local_30;
  undefined4 local_2c;
  undefined1 (**local_28) [16];
  undefined1 (*local_20) [16];
  undefined1 (*local_10) [16];
  
  local_980 = 0xb;
  local_984 = 0x800;
  local_988 = 0x14;
  local_98c = 0x28;
  local_994 = in_EDX * 2;
  local_9a0 = 20.0 / (double)in_EDX;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (long)(in_EDX * 6);
  uVar28 = SUB168(auVar33 * ZEXT816(4),0);
  if (SUB168(auVar33 * ZEXT816(4),8) != 0) {
    uVar28 = 0xffffffffffffffff;
  }
  local_990 = in_EDX;
  local_978 = in_RSI;
  local_970 = in_RDI;
  local_9b0 = operator_new__(uVar28);
  local_9b8 = (void *)((long)local_9b0 + (long)local_990 * 4);
  local_9c0 = (short *)((long)local_9b0 + (long)local_994 * 4 + (long)local_990 * 4);
  local_9c8 = (short *)((long)local_9b0 +
                       (long)local_990 * 4 + (long)local_994 * 4 + (long)local_990 * 4);
  local_9a8 = local_9b0;
  for (local_9dc = 0; local_9dc < local_990; local_9dc = local_9dc + 1) {
    local_9cc = (float)(((double)local_9dc + 0.5) * local_9a0 - 0.5);
    dVar32 = std::floor((double)(ulong)(uint)local_9cc);
    local_9d4 = (int)SUB84(dVar32,0);
    local_9cc = local_9cc - (float)local_9d4;
    *(int *)((long)local_9b0 + (long)local_9dc * 4) = local_9d4;
    local_9e0 = (1.0 - local_9cc) * 2048.0;
    local_9e4 = local_9cc * 2048.0;
    local_9f0[2] = (int)(local_9e0 +
                        (float)(~-(uint)(0.0 <= local_9e0) & 0xbf000000 |
                               -(uint)(0.0 <= local_9e0) & 0x3f000000));
    local_9f0[1] = 0xffff8000;
    piVar29 = std::max<int>(local_9f0 + 2,local_9f0 + 1);
    local_9f0[0] = 0x7fff;
    piVar29 = std::min<int>(piVar29,local_9f0);
    local_9c0[local_9dc << 1] = (short)*piVar29;
    local_9fc[2] = (int)(local_9e4 +
                        (float)(~-(uint)(0.0 <= local_9e4) & 0xbf000000 |
                               -(uint)(0.0 <= local_9e4) & 0x3f000000));
    local_9fc[1] = 0xffff8000;
    piVar29 = std::max<int>(local_9fc + 2,local_9fc + 1);
    local_9fc[0] = 0x7fff;
    piVar29 = std::min<int>(piVar29,local_9fc);
    local_9c0[local_9dc * 2 + 1] = (short)*piVar29;
  }
  for (local_a00 = 0; local_a00 < local_994; local_a00 = local_a00 + 1) {
    local_9d0 = (float)(((double)local_a00 + 0.5) * local_9a0 - 0.5);
    dVar32 = std::floor((double)(ulong)(uint)local_9d0);
    local_9d8 = (int)SUB84(dVar32,0);
    local_9d0 = local_9d0 - (float)local_9d8;
    *(int *)((long)local_9b8 + (long)local_a00 * 4) = local_9d8;
    local_a04 = (1.0 - local_9d0) * 2048.0;
    local_a08 = local_9d0 * 2048.0;
    local_a14[2] = (int)(local_a04 +
                        (float)(~-(uint)(0.0 <= local_a04) & 0xbf000000 |
                               -(uint)(0.0 <= local_a04) & 0x3f000000));
    local_a14[1] = 0xffff8000;
    piVar29 = std::max<int>(local_a14 + 2,local_a14 + 1);
    local_a14[0] = 0x7fff;
    piVar29 = std::min<int>(piVar29,local_a14);
    local_9c8[local_a00 << 1] = (short)*piVar29;
    local_a20[2] = (int)(local_a08 +
                        (float)(~-(uint)(0.0 <= local_a08) & 0xbf000000 |
                               -(uint)(0.0 <= local_a08) & 0x3f000000));
    local_a20[1] = 0xffff8000;
    piVar29 = std::max<int>(local_a20 + 2,local_a20 + 1);
    local_a20[0] = 0x7fff;
    piVar29 = std::min<int>(piVar29,local_a20);
    local_9c8[local_a00 * 2 + 1] = (short)*piVar29;
  }
  local_950 = &local_a68;
  local_954 = local_990;
  local_960 = 2;
  local_968 = 0;
  local_a68 = (undefined1 (*) [16])0x0;
  local_a60 = (int *)0x0;
  local_a58 = 0;
  local_a50 = 0;
  local_a48 = (long *)0x0;
  local_a40 = 0;
  local_a3c = 0;
  local_a38 = 0;
  local_a34 = 0;
  local_a30 = 0;
  local_a28 = 0;
  Mat::create((Mat *)CONCAT17(in_stack_ffffffffffffec17,
                              CONCAT16(in_stack_ffffffffffffec16,
                                       CONCAT15(in_stack_ffffffffffffec15,
                                                CONCAT14(in_stack_ffffffffffffec14,
                                                         CONCAT13(in_stack_ffffffffffffec13,
                                                                  CONCAT12(in_stack_ffffffffffffec12
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffec11,
                                                  in_stack_ffffffffffffec10))))))),
              CONCAT13(in_stack_ffffffffffffec0f,
                       CONCAT12(in_stack_ffffffffffffec0e,
                                CONCAT11(in_stack_ffffffffffffec0d,in_stack_ffffffffffffec0c))),
              in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8);
  local_930 = &local_ab0;
  local_934 = local_990;
  local_940 = 2;
  local_948 = 0;
  local_ab0 = (undefined1 (*) [16])0x0;
  local_aa8 = (int *)0x0;
  local_aa0 = 0;
  local_a98 = 0;
  local_a90 = (long *)0x0;
  local_a88 = 0;
  local_a84 = 0;
  local_a80 = 0;
  local_a7c = 0;
  local_a78 = 0;
  local_a70 = 0;
  Mat::create((Mat *)CONCAT17(in_stack_ffffffffffffec17,
                              CONCAT16(in_stack_ffffffffffffec16,
                                       CONCAT15(in_stack_ffffffffffffec15,
                                                CONCAT14(in_stack_ffffffffffffec14,
                                                         CONCAT13(in_stack_ffffffffffffec13,
                                                                  CONCAT12(in_stack_ffffffffffffec12
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffec11,
                                                  in_stack_ffffffffffffec10))))))),
              CONCAT13(in_stack_ffffffffffffec0f,
                       CONCAT12(in_stack_ffffffffffffec0e,
                                CONCAT11(in_stack_ffffffffffffec0d,in_stack_ffffffffffffec0c))),
              in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8);
  local_920 = &local_a68;
  local_ac8 = local_a68;
  local_928 = &local_ab0;
  local_ad0 = local_ab0;
  for (local_adc = 0; local_adc < local_990; local_adc = local_adc + 1) {
    *(undefined2 *)(*local_ab0 + (long)local_adc * 2) = 0;
  }
  local_ae0 = -2;
  for (local_ae4 = 0; pauVar27 = local_ac8, local_ae4 < local_994; local_ae4 = local_ae4 + 1) {
    local_9d8 = *(int *)((long)local_9b8 + (long)local_ae4 * 4);
    if (local_9d8 != local_ae0) {
      if (local_9d8 == local_ae0 + 1) {
        local_ac8 = local_ad0;
        local_ad0 = pauVar27;
        pbVar30 = (byte *)(local_970 + (local_9d8 + 1) * 10);
        if (local_9d8 < 0x27) {
          local_b10 = local_9c0;
          for (local_b1c = 0; local_b1c < local_990; local_b1c = local_b1c + 1) {
            local_9d4 = *(int *)((long)local_9b0 + (long)local_b1c * 4);
            if (local_9d4 < 0) {
              local_b21 = 0;
              local_b22 = *pbVar30 & 0xf;
            }
            else if (local_9d4 < 0x13) {
              if (local_9d4 % 2 == 0) {
                local_e44 = pbVar30[local_9d4 / 2] & 0xf;
              }
              else {
                local_e44 = (byte)((int)(pbVar30[local_9d4 / 2] & 0xf0) >> 4);
              }
              local_b21 = local_e44;
              if (local_9d4 % 2 == 0) {
                local_e5c = (byte)((int)(pbVar30[local_9d4 / 2] & 0xf0) >> 4);
              }
              else {
                local_e5c = pbVar30[local_9d4 / 2 + 1] & 0xf;
              }
              local_b22 = local_e5c;
            }
            else {
              local_b21 = (byte)((int)(pbVar30[9] & 0xf0) >> 4);
              local_b22 = 0;
            }
            *(short *)(*pauVar27 + (long)local_b1c * 2) =
                 (short)((int)(((uint)local_b21 * (int)*local_b10 +
                               (uint)local_b22 * (int)local_b10[1]) * 0x11) >> 4);
            local_b10 = local_b10 + 2;
          }
        }
        else {
          for (local_b04 = 0; local_b04 < local_990; local_b04 = local_b04 + 1) {
            *(undefined2 *)(*pauVar27 + (long)local_b04 * 2) = 0;
          }
        }
      }
      else {
        pbVar30 = (byte *)(local_970 + local_9d8 * 10);
        pbVar31 = (byte *)(local_970 + (local_9d8 + 1) * 10);
        if (local_9d8 < 0x27) {
          local_b68 = local_9c0;
          for (local_b7c = 0; local_b7c < local_990; local_b7c = local_b7c + 1) {
            local_9d4 = *(int *)((long)local_9b0 + (long)local_b7c * 4);
            sVar1 = *local_b68;
            sVar2 = local_b68[1];
            if (local_9d4 < 0) {
              local_b81 = 0;
              local_b82 = *pbVar30 & 0xf;
              local_b83 = 0;
              local_b84 = *pbVar31 & 0xf;
            }
            else if (local_9d4 < 0x13) {
              if (local_9d4 % 2 == 0) {
                local_ea4 = pbVar30[local_9d4 / 2] & 0xf;
              }
              else {
                local_ea4 = (byte)((int)(pbVar30[local_9d4 / 2] & 0xf0) >> 4);
              }
              local_b81 = local_ea4;
              if (local_9d4 % 2 == 0) {
                local_ebc = (byte)((int)(pbVar30[local_9d4 / 2] & 0xf0) >> 4);
              }
              else {
                local_ebc = pbVar30[local_9d4 / 2 + 1] & 0xf;
              }
              local_b82 = local_ebc;
              if (local_9d4 % 2 == 0) {
                local_ed4 = pbVar31[local_9d4 / 2] & 0xf;
              }
              else {
                local_ed4 = (byte)((int)(pbVar31[local_9d4 / 2] & 0xf0) >> 4);
              }
              local_b83 = local_ed4;
              if (local_9d4 % 2 == 0) {
                local_eec = (byte)((int)(pbVar31[local_9d4 / 2] & 0xf0) >> 4);
              }
              else {
                local_eec = pbVar31[local_9d4 / 2 + 1] & 0xf;
              }
              local_b84 = local_eec;
            }
            else {
              local_b81 = (byte)((int)(pbVar30[9] & 0xf0) >> 4);
              local_b82 = 0;
              local_b83 = (byte)((int)(pbVar31[9] & 0xf0) >> 4);
              local_b84 = 0;
            }
            *(short *)(*local_ac8 + (long)local_b7c * 2) =
                 (short)((int)(((uint)local_b81 * (int)sVar1 + (uint)local_b82 * (int)sVar2) * 0x11)
                        >> 4);
            *(short *)(*local_ad0 + (long)local_b7c * 2) =
                 (short)((int)(((uint)local_b83 * (int)sVar1 + (uint)local_b84 * (int)sVar2) * 0x11)
                        >> 4);
            local_b68 = local_b68 + 2;
          }
        }
        else {
          local_b40 = local_9c0;
          for (local_b54 = 0; local_b54 < local_990; local_b54 = local_b54 + 1) {
            local_9d4 = *(int *)((long)local_9b0 + (long)local_b54 * 4);
            if (local_9d4 < 0) {
              local_b59 = 0;
              local_b5a = *pbVar30 & 0xf;
            }
            else if (local_9d4 < 0x13) {
              if (local_9d4 % 2 == 0) {
                local_e74 = pbVar30[local_9d4 / 2] & 0xf;
              }
              else {
                local_e74 = (byte)((int)(pbVar30[local_9d4 / 2] & 0xf0) >> 4);
              }
              local_b59 = local_e74;
              if (local_9d4 % 2 == 0) {
                local_e8c = (byte)((int)(pbVar30[local_9d4 / 2] & 0xf0) >> 4);
              }
              else {
                local_e8c = pbVar30[local_9d4 / 2 + 1] & 0xf;
              }
              local_b5a = local_e8c;
            }
            else {
              local_b59 = (byte)((int)(pbVar30[9] & 0xf0) >> 4);
              local_b5a = 0;
            }
            *(short *)(*local_ac8 + (long)local_b54 * 2) =
                 (short)((int)(((uint)local_b59 * (int)*local_b40 +
                               (uint)local_b5a * (int)local_b40[1]) * 0x11) >> 4);
            *(undefined2 *)(*local_ad0 + (long)local_b54 * 2) = 0;
            local_b40 = local_b40 + 2;
          }
        }
      }
    }
    if ((local_ae4 + 1 < local_994) &&
       (*(int *)((long)local_9b8 + (long)(local_ae4 + 1) * 4) == local_9d8)) {
      local_90a = *local_9c8;
      local_90c = local_9c8[1];
      local_90e = local_9c8[2];
      local_910 = local_9c8[3];
      local_b98 = local_ac8;
      local_ba0 = local_ad0;
      local_ba8 = (undefined8 *)(local_978 + local_990 * local_ae4);
      local_bb0 = (undefined8 *)(local_978 + local_990 * (local_ae4 + 1));
      local_168 = CONCAT26(local_90a,CONCAT24(local_90a,CONCAT22(local_90a,local_90a)));
      uStack_160 = CONCAT26(local_90a,CONCAT24(local_90a,CONCAT22(local_90a,local_90a)));
      local_148 = CONCAT26(local_90c,CONCAT24(local_90c,CONCAT22(local_90c,local_90c)));
      uStack_140 = CONCAT26(local_90c,CONCAT24(local_90c,CONCAT22(local_90c,local_90c)));
      local_128 = CONCAT26(local_90e,CONCAT24(local_90e,CONCAT22(local_90e,local_90e)));
      uStack_120 = CONCAT26(local_90e,CONCAT24(local_90e,CONCAT22(local_90e,local_90e)));
      local_108 = CONCAT26(local_910,CONCAT24(local_910,CONCAT22(local_910,local_910)));
      uStack_100 = CONCAT26(local_910,CONCAT24(local_910,CONCAT22(local_910,local_910)));
      local_912 = 2;
      local_ca = 2;
      local_cc = 2;
      local_ce = 2;
      local_d0 = 2;
      local_d2 = 2;
      local_d4 = 2;
      local_d6 = 2;
      local_d8 = 2;
      local_e8 = 0x2000200020002;
      uStack_e0 = 0x2000200020002;
      for (local_bb4 = 0; local_bb4 + 0xf < local_990; local_bb4 = local_bb4 + 0x10) {
        local_8b0 = local_b98;
        local_4b8 = *(undefined8 *)*local_b98;
        uStack_4b0 = *(undefined8 *)(*local_b98 + 8);
        local_8b8 = local_b98 + 1;
        local_4f8 = *(undefined8 *)*local_8b8;
        uStack_4f0 = *(undefined8 *)(local_b98[1] + 8);
        local_8c0 = local_ba0;
        local_4d8 = *(undefined8 *)*local_ba0;
        uStack_4d0 = *(undefined8 *)(*local_ba0 + 8);
        local_8c8 = local_ba0 + 1;
        local_518 = *(undefined8 *)*local_8c8;
        uStack_510 = *(undefined8 *)(local_ba0[1] + 8);
        auVar17._8_8_ = uStack_160;
        auVar17._0_8_ = local_168;
        auVar33 = pmulhw(*local_b98,auVar17);
        auVar16._8_8_ = uStack_140;
        auVar16._0_8_ = local_148;
        auVar34 = pmulhw(*local_ba0,auVar16);
        local_1008 = auVar34._0_8_;
        uStack_1000 = auVar34._8_8_;
        local_ff8 = auVar33._0_8_;
        uStack_ff0 = auVar33._8_8_;
        local_678._0_2_ = auVar33._0_2_;
        local_678._2_2_ = auVar33._2_2_;
        local_678._4_2_ = auVar33._4_2_;
        local_678._6_2_ = auVar33._6_2_;
        uStack_670._0_2_ = auVar33._8_2_;
        uStack_670._2_2_ = auVar33._10_2_;
        uStack_670._4_2_ = auVar33._12_2_;
        uStack_670._6_2_ = auVar33._14_2_;
        local_688._0_2_ = auVar34._0_2_;
        local_688._2_2_ = auVar34._2_2_;
        local_688._4_2_ = auVar34._4_2_;
        local_688._6_2_ = auVar34._6_2_;
        uStack_680._0_2_ = auVar34._8_2_;
        uStack_680._2_2_ = auVar34._10_2_;
        uStack_680._4_2_ = auVar34._12_2_;
        uStack_680._6_2_ = auVar34._14_2_;
        local_6f8 = CONCAT26(local_678._6_2_ + local_688._6_2_,
                             CONCAT24(local_678._4_2_ + local_688._4_2_,
                                      CONCAT22(local_678._2_2_ + local_688._2_2_,
                                               (short)local_678 + (short)local_688)));
        uStack_6f0 = CONCAT26(uStack_670._6_2_ + uStack_680._6_2_,
                              CONCAT24(uStack_670._4_2_ + uStack_680._4_2_,
                                       CONCAT22(uStack_670._2_2_ + uStack_680._2_2_,
                                                (short)uStack_670 + (short)uStack_680)));
        auVar15._8_8_ = uStack_160;
        auVar15._0_8_ = local_168;
        auVar33 = pmulhw(*local_8b8,auVar15);
        auVar14._8_8_ = uStack_140;
        auVar14._0_8_ = local_148;
        auVar34 = pmulhw(*local_8c8,auVar14);
        local_1038 = auVar34._0_8_;
        uStack_1030 = auVar34._8_8_;
        local_1028 = auVar33._0_8_;
        uStack_1020 = auVar33._8_8_;
        local_698._0_2_ = auVar33._0_2_;
        local_698._2_2_ = auVar33._2_2_;
        local_698._4_2_ = auVar33._4_2_;
        local_698._6_2_ = auVar33._6_2_;
        uStack_690._0_2_ = auVar33._8_2_;
        uStack_690._2_2_ = auVar33._10_2_;
        uStack_690._4_2_ = auVar33._12_2_;
        uStack_690._6_2_ = auVar33._14_2_;
        local_6a8._0_2_ = auVar34._0_2_;
        local_6a8._2_2_ = auVar34._2_2_;
        local_6a8._4_2_ = auVar34._4_2_;
        local_6a8._6_2_ = auVar34._6_2_;
        uStack_6a0._0_2_ = auVar34._8_2_;
        uStack_6a0._2_2_ = auVar34._10_2_;
        uStack_6a0._4_2_ = auVar34._12_2_;
        uStack_6a0._6_2_ = auVar34._14_2_;
        local_718 = CONCAT26(local_698._6_2_ + local_6a8._6_2_,
                             CONCAT24(local_698._4_2_ + local_6a8._4_2_,
                                      CONCAT22(local_698._2_2_ + local_6a8._2_2_,
                                               (short)local_698 + (short)local_6a8)));
        uStack_710 = CONCAT26(uStack_690._6_2_ + uStack_6a0._6_2_,
                              CONCAT24(uStack_690._4_2_ + uStack_6a0._4_2_,
                                       CONCAT22(uStack_690._2_2_ + uStack_6a0._2_2_,
                                                (short)uStack_690 + (short)uStack_6a0)));
        auVar13._8_8_ = uStack_120;
        auVar13._0_8_ = local_128;
        auVar33 = pmulhw(*local_b98,auVar13);
        auVar12._8_8_ = uStack_100;
        auVar12._0_8_ = local_108;
        auVar34 = pmulhw(*local_ba0,auVar12);
        local_1068 = auVar34._0_8_;
        uStack_1060 = auVar34._8_8_;
        local_1058 = auVar33._0_8_;
        uStack_1050 = auVar33._8_8_;
        local_6b8._0_2_ = auVar33._0_2_;
        local_6b8._2_2_ = auVar33._2_2_;
        local_6b8._4_2_ = auVar33._4_2_;
        local_6b8._6_2_ = auVar33._6_2_;
        uStack_6b0._0_2_ = auVar33._8_2_;
        uStack_6b0._2_2_ = auVar33._10_2_;
        uStack_6b0._4_2_ = auVar33._12_2_;
        uStack_6b0._6_2_ = auVar33._14_2_;
        local_6c8._0_2_ = auVar34._0_2_;
        local_6c8._2_2_ = auVar34._2_2_;
        local_6c8._4_2_ = auVar34._4_2_;
        local_6c8._6_2_ = auVar34._6_2_;
        uStack_6c0._0_2_ = auVar34._8_2_;
        uStack_6c0._2_2_ = auVar34._10_2_;
        uStack_6c0._4_2_ = auVar34._12_2_;
        uStack_6c0._6_2_ = auVar34._14_2_;
        local_738 = CONCAT26(local_6b8._6_2_ + local_6c8._6_2_,
                             CONCAT24(local_6b8._4_2_ + local_6c8._4_2_,
                                      CONCAT22(local_6b8._2_2_ + local_6c8._2_2_,
                                               (short)local_6b8 + (short)local_6c8)));
        uStack_730 = CONCAT26(uStack_6b0._6_2_ + uStack_6c0._6_2_,
                              CONCAT24(uStack_6b0._4_2_ + uStack_6c0._4_2_,
                                       CONCAT22(uStack_6b0._2_2_ + uStack_6c0._2_2_,
                                                (short)uStack_6b0 + (short)uStack_6c0)));
        auVar11._8_8_ = uStack_120;
        auVar11._0_8_ = local_128;
        auVar33 = pmulhw(*local_8b8,auVar11);
        auVar10._8_8_ = uStack_100;
        auVar10._0_8_ = local_108;
        auVar34 = pmulhw(*local_8c8,auVar10);
        local_1098 = auVar34._0_8_;
        uStack_1090 = auVar34._8_8_;
        local_1088 = auVar33._0_8_;
        uStack_1080 = auVar33._8_8_;
        local_6d8._0_2_ = auVar33._0_2_;
        local_6d8._2_2_ = auVar33._2_2_;
        local_6d8._4_2_ = auVar33._4_2_;
        local_6d8._6_2_ = auVar33._6_2_;
        uStack_6d0._0_2_ = auVar33._8_2_;
        uStack_6d0._2_2_ = auVar33._10_2_;
        uStack_6d0._4_2_ = auVar33._12_2_;
        uStack_6d0._6_2_ = auVar33._14_2_;
        local_6e8._0_2_ = auVar34._0_2_;
        local_6e8._2_2_ = auVar34._2_2_;
        local_6e8._4_2_ = auVar34._4_2_;
        local_6e8._6_2_ = auVar34._6_2_;
        uStack_6e0._0_2_ = auVar34._8_2_;
        uStack_6e0._2_2_ = auVar34._10_2_;
        uStack_6e0._4_2_ = auVar34._12_2_;
        uStack_6e0._6_2_ = auVar34._14_2_;
        local_758 = CONCAT26(local_6d8._6_2_ + local_6e8._6_2_,
                             CONCAT24(local_6d8._4_2_ + local_6e8._4_2_,
                                      CONCAT22(local_6d8._2_2_ + local_6e8._2_2_,
                                               (short)local_6d8 + (short)local_6e8)));
        uStack_750 = CONCAT26(uStack_6d0._6_2_ + uStack_6e0._6_2_,
                              CONCAT24(uStack_6d0._4_2_ + uStack_6e0._4_2_,
                                       CONCAT22(uStack_6d0._2_2_ + uStack_6e0._2_2_,
                                                (short)uStack_6d0 + (short)uStack_6e0)));
        local_318 = CONCAT26(local_678._6_2_ + local_688._6_2_ + 2,
                             CONCAT24(local_678._4_2_ + local_688._4_2_ + 2,
                                      CONCAT22(local_678._2_2_ + local_688._2_2_ + 2,
                                               (short)local_678 + (short)local_688 + 2)));
        uStack_310 = CONCAT26(uStack_670._6_2_ + uStack_680._6_2_ + 2,
                              CONCAT24(uStack_670._4_2_ + uStack_680._4_2_ + 2,
                                       CONCAT22(uStack_670._2_2_ + uStack_680._2_2_ + 2,
                                                (short)uStack_670 + (short)uStack_680 + 2)));
        local_31c = 2;
        auVar26._8_8_ = uStack_310;
        auVar26._0_8_ = local_318;
        auVar33 = psraw(auVar26,ZEXT416(2));
        local_10c8 = auVar33._0_8_;
        uStack_10c0 = auVar33._8_8_;
        local_338 = CONCAT26(local_698._6_2_ + local_6a8._6_2_ + 2,
                             CONCAT24(local_698._4_2_ + local_6a8._4_2_ + 2,
                                      CONCAT22(local_698._2_2_ + local_6a8._2_2_ + 2,
                                               (short)local_698 + (short)local_6a8 + 2)));
        uStack_330 = CONCAT26(uStack_690._6_2_ + uStack_6a0._6_2_ + 2,
                              CONCAT24(uStack_690._4_2_ + uStack_6a0._4_2_ + 2,
                                       CONCAT22(uStack_690._2_2_ + uStack_6a0._2_2_ + 2,
                                                (short)uStack_690 + (short)uStack_6a0 + 2)));
        local_33c = 2;
        auVar25._8_8_ = uStack_330;
        auVar25._0_8_ = local_338;
        auVar34 = psraw(auVar25,ZEXT416(2));
        local_10e8 = auVar34._0_8_;
        uStack_10e0 = auVar34._8_8_;
        local_358 = CONCAT26(local_6b8._6_2_ + local_6c8._6_2_ + 2,
                             CONCAT24(local_6b8._4_2_ + local_6c8._4_2_ + 2,
                                      CONCAT22(local_6b8._2_2_ + local_6c8._2_2_ + 2,
                                               (short)local_6b8 + (short)local_6c8 + 2)));
        uStack_350 = CONCAT26(uStack_6b0._6_2_ + uStack_6c0._6_2_ + 2,
                              CONCAT24(uStack_6b0._4_2_ + uStack_6c0._4_2_ + 2,
                                       CONCAT22(uStack_6b0._2_2_ + uStack_6c0._2_2_ + 2,
                                                (short)uStack_6b0 + (short)uStack_6c0 + 2)));
        local_35c = 2;
        auVar24._8_8_ = uStack_350;
        auVar24._0_8_ = local_358;
        auVar35 = psraw(auVar24,ZEXT416(2));
        local_1108 = auVar35._0_8_;
        uStack_1100 = auVar35._8_8_;
        local_378 = CONCAT26(local_6d8._6_2_ + local_6e8._6_2_ + 2,
                             CONCAT24(local_6d8._4_2_ + local_6e8._4_2_ + 2,
                                      CONCAT22(local_6d8._2_2_ + local_6e8._2_2_ + 2,
                                               (short)local_6d8 + (short)local_6e8 + 2)));
        uStack_370 = CONCAT26(uStack_6d0._6_2_ + uStack_6e0._6_2_ + 2,
                              CONCAT24(uStack_6d0._4_2_ + uStack_6e0._4_2_ + 2,
                                       CONCAT22(uStack_6d0._2_2_ + uStack_6e0._2_2_ + 2,
                                                (short)uStack_6d0 + (short)uStack_6e0 + 2)));
        local_37c = 2;
        auVar23._8_8_ = uStack_370;
        auVar23._0_8_ = local_378;
        auVar36 = psraw(auVar23,ZEXT416(2));
        local_1128 = auVar36._0_8_;
        uStack_1120 = auVar36._8_8_;
        local_258._0_2_ = auVar33._0_2_;
        local_258._2_2_ = auVar33._2_2_;
        local_258._4_2_ = auVar33._4_2_;
        local_258._6_2_ = auVar33._6_2_;
        uStack_250._0_2_ = auVar33._8_2_;
        uStack_250._2_2_ = auVar33._10_2_;
        uStack_250._4_2_ = auVar33._12_2_;
        uStack_250._6_2_ = auVar33._14_2_;
        local_268._0_2_ = auVar34._0_2_;
        local_268._2_2_ = auVar34._2_2_;
        local_268._4_2_ = auVar34._4_2_;
        local_268._6_2_ = auVar34._6_2_;
        uStack_260._0_2_ = auVar34._8_2_;
        uStack_260._2_2_ = auVar34._10_2_;
        uStack_260._4_2_ = auVar34._12_2_;
        uStack_260._6_2_ = auVar34._14_2_;
        local_208 = CONCAT17((0 < uStack_250._6_2_) * (uStack_250._6_2_ < 0x100) * auVar33[0xe] -
                             (0xff < uStack_250._6_2_),
                             CONCAT16((0 < uStack_250._4_2_) * (uStack_250._4_2_ < 0x100) *
                                      auVar33[0xc] - (0xff < uStack_250._4_2_),
                                      CONCAT15((0 < uStack_250._2_2_) * (uStack_250._2_2_ < 0x100) *
                                               auVar33[10] - (0xff < uStack_250._2_2_),
                                               CONCAT14((0 < (short)uStack_250) *
                                                        ((short)uStack_250 < 0x100) * auVar33[8] -
                                                        (0xff < (short)uStack_250),
                                                        CONCAT13((0 < local_258._6_2_) *
                                                                 (local_258._6_2_ < 0x100) *
                                                                 auVar33[6] -
                                                                 (0xff < local_258._6_2_),
                                                                 CONCAT12((0 < local_258._4_2_) *
                                                                          (local_258._4_2_ < 0x100)
                                                                          * auVar33[4] -
                                                                          (0xff < local_258._4_2_),
                                                                          CONCAT11((0 < local_258.
                                                                                        _2_2_) *
                                                                                   (local_258._2_2_
                                                                                   < 0x100) *
                                                                                   auVar33[2] -
                                                                                   (0xff < local_258
                                                  ._2_2_),(0 < (short)local_258) *
                                                          ((short)local_258 < 0x100) * auVar33[0] -
                                                          (0xff < (short)local_258))))))));
        uStack_200 = CONCAT17((0 < uStack_260._6_2_) * (uStack_260._6_2_ < 0x100) * auVar34[0xe] -
                              (0xff < uStack_260._6_2_),
                              CONCAT16((0 < uStack_260._4_2_) * (uStack_260._4_2_ < 0x100) *
                                       auVar34[0xc] - (0xff < uStack_260._4_2_),
                                       CONCAT15((0 < uStack_260._2_2_) * (uStack_260._2_2_ < 0x100)
                                                * auVar34[10] - (0xff < uStack_260._2_2_),
                                                CONCAT14((0 < (short)uStack_260) *
                                                         ((short)uStack_260 < 0x100) * auVar34[8] -
                                                         (0xff < (short)uStack_260),
                                                         CONCAT13((0 < local_268._6_2_) *
                                                                  (local_268._6_2_ < 0x100) *
                                                                  auVar34[6] -
                                                                  (0xff < local_268._6_2_),
                                                                  CONCAT12((0 < local_268._4_2_) *
                                                                           (local_268._4_2_ < 0x100)
                                                                           * auVar34[4] -
                                                                           (0xff < local_268._4_2_),
                                                                           CONCAT11((0 < local_268.
                                                                                         _2_2_) *
                                                                                    (local_268._2_2_
                                                                                    < 0x100) *
                                                                                    auVar34[2] -
                                                                                    (0xff < 
                                                  local_268._2_2_),
                                                  (0 < (short)local_268) *
                                                  ((short)local_268 < 0x100) * auVar34[0] -
                                                  (0xff < (short)local_268))))))));
        local_278._0_2_ = auVar35._0_2_;
        local_278._2_2_ = auVar35._2_2_;
        local_278._4_2_ = auVar35._4_2_;
        local_278._6_2_ = auVar35._6_2_;
        uStack_270._0_2_ = auVar35._8_2_;
        uStack_270._2_2_ = auVar35._10_2_;
        uStack_270._4_2_ = auVar35._12_2_;
        uStack_270._6_2_ = auVar35._14_2_;
        local_288._0_2_ = auVar36._0_2_;
        local_288._2_2_ = auVar36._2_2_;
        local_288._4_2_ = auVar36._4_2_;
        local_288._6_2_ = auVar36._6_2_;
        uStack_280._0_2_ = auVar36._8_2_;
        uStack_280._2_2_ = auVar36._10_2_;
        uStack_280._4_2_ = auVar36._12_2_;
        uStack_280._6_2_ = auVar36._14_2_;
        local_228 = CONCAT17((0 < uStack_270._6_2_) * (uStack_270._6_2_ < 0x100) * auVar35[0xe] -
                             (0xff < uStack_270._6_2_),
                             CONCAT16((0 < uStack_270._4_2_) * (uStack_270._4_2_ < 0x100) *
                                      auVar35[0xc] - (0xff < uStack_270._4_2_),
                                      CONCAT15((0 < uStack_270._2_2_) * (uStack_270._2_2_ < 0x100) *
                                               auVar35[10] - (0xff < uStack_270._2_2_),
                                               CONCAT14((0 < (short)uStack_270) *
                                                        ((short)uStack_270 < 0x100) * auVar35[8] -
                                                        (0xff < (short)uStack_270),
                                                        CONCAT13((0 < local_278._6_2_) *
                                                                 (local_278._6_2_ < 0x100) *
                                                                 auVar35[6] -
                                                                 (0xff < local_278._6_2_),
                                                                 CONCAT12((0 < local_278._4_2_) *
                                                                          (local_278._4_2_ < 0x100)
                                                                          * auVar35[4] -
                                                                          (0xff < local_278._4_2_),
                                                                          CONCAT11((0 < local_278.
                                                                                        _2_2_) *
                                                                                   (local_278._2_2_
                                                                                   < 0x100) *
                                                                                   auVar35[2] -
                                                                                   (0xff < local_278
                                                  ._2_2_),(0 < (short)local_278) *
                                                          ((short)local_278 < 0x100) * auVar35[0] -
                                                          (0xff < (short)local_278))))))));
        uStack_220 = CONCAT17((0 < uStack_280._6_2_) * (uStack_280._6_2_ < 0x100) * auVar36[0xe] -
                              (0xff < uStack_280._6_2_),
                              CONCAT16((0 < uStack_280._4_2_) * (uStack_280._4_2_ < 0x100) *
                                       auVar36[0xc] - (0xff < uStack_280._4_2_),
                                       CONCAT15((0 < uStack_280._2_2_) * (uStack_280._2_2_ < 0x100)
                                                * auVar36[10] - (0xff < uStack_280._2_2_),
                                                CONCAT14((0 < (short)uStack_280) *
                                                         ((short)uStack_280 < 0x100) * auVar36[8] -
                                                         (0xff < (short)uStack_280),
                                                         CONCAT13((0 < local_288._6_2_) *
                                                                  (local_288._6_2_ < 0x100) *
                                                                  auVar36[6] -
                                                                  (0xff < local_288._6_2_),
                                                                  CONCAT12((0 < local_288._4_2_) *
                                                                           (local_288._4_2_ < 0x100)
                                                                           * auVar36[4] -
                                                                           (0xff < local_288._4_2_),
                                                                           CONCAT11((0 < local_288.
                                                                                         _2_2_) *
                                                                                    (local_288._2_2_
                                                                                    < 0x100) *
                                                                                    auVar36[2] -
                                                                                    (0xff < 
                                                  local_288._2_2_),
                                                  (0 < (short)local_288) *
                                                  ((short)local_288 < 0x100) * auVar36[0] -
                                                  (0xff < (short)local_288))))))));
        local_1f0 = local_ba8;
        *local_ba8 = local_208;
        local_ba8[1] = uStack_200;
        local_210 = local_bb0;
        *local_bb0 = local_228;
        local_bb0[1] = uStack_220;
        local_ba8 = local_ba8 + 2;
        local_bb0 = local_bb0 + 2;
        local_b98 = local_b98 + 2;
        local_ba0 = local_ba0 + 2;
        local_768 = local_e8;
        uStack_760 = uStack_e0;
        local_748 = local_e8;
        uStack_740 = uStack_e0;
        local_728 = local_e8;
        uStack_720 = uStack_e0;
        local_708 = local_e8;
        uStack_700 = uStack_e0;
        local_6e8 = local_1098;
        uStack_6e0 = uStack_1090;
        local_6d8 = local_1088;
        uStack_6d0 = uStack_1080;
        local_6c8 = local_1068;
        uStack_6c0 = uStack_1060;
        local_6b8 = local_1058;
        uStack_6b0 = uStack_1050;
        local_6a8 = local_1038;
        uStack_6a0 = uStack_1030;
        local_698 = local_1028;
        uStack_690 = uStack_1020;
        local_688 = local_1008;
        uStack_680 = uStack_1000;
        local_678 = local_ff8;
        uStack_670 = uStack_ff0;
        local_528 = local_108;
        uStack_520 = uStack_100;
        local_508 = local_128;
        uStack_500 = uStack_120;
        local_4e8 = local_108;
        uStack_4e0 = uStack_100;
        local_4c8 = local_128;
        uStack_4c0 = uStack_120;
        local_4a8 = local_148;
        uStack_4a0 = uStack_140;
        local_498 = local_518;
        uStack_490 = uStack_510;
        local_488 = local_168;
        uStack_480 = uStack_160;
        local_478 = local_4f8;
        uStack_470 = uStack_4f0;
        local_468 = local_148;
        uStack_460 = uStack_140;
        local_458 = local_4d8;
        uStack_450 = uStack_4d0;
        local_448 = local_168;
        uStack_440 = uStack_160;
        local_438 = local_4b8;
        uStack_430 = uStack_4b0;
        local_288 = local_1128;
        uStack_280 = uStack_1120;
        local_278 = local_1108;
        uStack_270 = uStack_1100;
        local_268 = local_10e8;
        uStack_260 = uStack_10e0;
        local_258 = local_10c8;
        uStack_250 = uStack_10c0;
      }
      for (; local_bb4 + 7 < local_990; local_bb4 = local_bb4 + 8) {
        local_8d0 = local_b98;
        local_578 = *(undefined8 *)*local_b98;
        uStack_570 = *(undefined8 *)(*local_b98 + 8);
        local_8d8 = local_ba0;
        local_598 = *(undefined8 *)*local_ba0;
        uStack_590 = *(undefined8 *)(*local_ba0 + 8);
        auVar9._8_8_ = uStack_160;
        auVar9._0_8_ = local_168;
        auVar33 = pmulhw(*local_b98,auVar9);
        auVar8._8_8_ = uStack_140;
        auVar8._0_8_ = local_148;
        auVar34 = pmulhw(*local_ba0,auVar8);
        local_1188 = auVar34._0_8_;
        uStack_1180 = auVar34._8_8_;
        local_1178 = auVar33._0_8_;
        uStack_1170 = auVar33._8_8_;
        local_778._0_2_ = auVar33._0_2_;
        local_778._2_2_ = auVar33._2_2_;
        local_778._4_2_ = auVar33._4_2_;
        local_778._6_2_ = auVar33._6_2_;
        uStack_770._0_2_ = auVar33._8_2_;
        uStack_770._2_2_ = auVar33._10_2_;
        uStack_770._4_2_ = auVar33._12_2_;
        uStack_770._6_2_ = auVar33._14_2_;
        local_788._0_2_ = auVar34._0_2_;
        local_788._2_2_ = auVar34._2_2_;
        local_788._4_2_ = auVar34._4_2_;
        local_788._6_2_ = auVar34._6_2_;
        uStack_780._0_2_ = auVar34._8_2_;
        uStack_780._2_2_ = auVar34._10_2_;
        uStack_780._4_2_ = auVar34._12_2_;
        uStack_780._6_2_ = auVar34._14_2_;
        local_7b8 = CONCAT26(local_778._6_2_ + local_788._6_2_,
                             CONCAT24(local_778._4_2_ + local_788._4_2_,
                                      CONCAT22(local_778._2_2_ + local_788._2_2_,
                                               (short)local_778 + (short)local_788)));
        uStack_7b0 = CONCAT26(uStack_770._6_2_ + uStack_780._6_2_,
                              CONCAT24(uStack_770._4_2_ + uStack_780._4_2_,
                                       CONCAT22(uStack_770._2_2_ + uStack_780._2_2_,
                                                (short)uStack_770 + (short)uStack_780)));
        auVar7._8_8_ = uStack_120;
        auVar7._0_8_ = local_128;
        auVar33 = pmulhw(*local_b98,auVar7);
        auVar6._8_8_ = uStack_100;
        auVar6._0_8_ = local_108;
        auVar34 = pmulhw(*local_ba0,auVar6);
        local_11b8 = auVar34._0_8_;
        uStack_11b0 = auVar34._8_8_;
        local_11a8 = auVar33._0_8_;
        uStack_11a0 = auVar33._8_8_;
        local_798._0_2_ = auVar33._0_2_;
        local_798._2_2_ = auVar33._2_2_;
        local_798._4_2_ = auVar33._4_2_;
        local_798._6_2_ = auVar33._6_2_;
        uStack_790._0_2_ = auVar33._8_2_;
        uStack_790._2_2_ = auVar33._10_2_;
        uStack_790._4_2_ = auVar33._12_2_;
        uStack_790._6_2_ = auVar33._14_2_;
        local_7a8._0_2_ = auVar34._0_2_;
        local_7a8._2_2_ = auVar34._2_2_;
        local_7a8._4_2_ = auVar34._4_2_;
        local_7a8._6_2_ = auVar34._6_2_;
        uStack_7a0._0_2_ = auVar34._8_2_;
        uStack_7a0._2_2_ = auVar34._10_2_;
        uStack_7a0._4_2_ = auVar34._12_2_;
        uStack_7a0._6_2_ = auVar34._14_2_;
        local_7d8 = CONCAT26(local_798._6_2_ + local_7a8._6_2_,
                             CONCAT24(local_798._4_2_ + local_7a8._4_2_,
                                      CONCAT22(local_798._2_2_ + local_7a8._2_2_,
                                               (short)local_798 + (short)local_7a8)));
        uStack_7d0 = CONCAT26(uStack_790._6_2_ + uStack_7a0._6_2_,
                              CONCAT24(uStack_790._4_2_ + uStack_7a0._4_2_,
                                       CONCAT22(uStack_790._2_2_ + uStack_7a0._2_2_,
                                                (short)uStack_790 + (short)uStack_7a0)));
        local_398 = CONCAT26(local_778._6_2_ + local_788._6_2_ + 2,
                             CONCAT24(local_778._4_2_ + local_788._4_2_ + 2,
                                      CONCAT22(local_778._2_2_ + local_788._2_2_ + 2,
                                               (short)local_778 + (short)local_788 + 2)));
        uStack_390 = CONCAT26(uStack_770._6_2_ + uStack_780._6_2_ + 2,
                              CONCAT24(uStack_770._4_2_ + uStack_780._4_2_ + 2,
                                       CONCAT22(uStack_770._2_2_ + uStack_780._2_2_ + 2,
                                                (short)uStack_770 + (short)uStack_780 + 2)));
        local_39c = 2;
        auVar22._8_8_ = uStack_390;
        auVar22._0_8_ = local_398;
        auVar33 = psraw(auVar22,ZEXT416(2));
        local_11e8 = auVar33._0_8_;
        uStack_11e0 = auVar33._8_8_;
        local_3b8 = CONCAT26(local_798._6_2_ + local_7a8._6_2_ + 2,
                             CONCAT24(local_798._4_2_ + local_7a8._4_2_ + 2,
                                      CONCAT22(local_798._2_2_ + local_7a8._2_2_ + 2,
                                               (short)local_798 + (short)local_7a8 + 2)));
        uStack_3b0 = CONCAT26(uStack_790._6_2_ + uStack_7a0._6_2_ + 2,
                              CONCAT24(uStack_790._4_2_ + uStack_7a0._4_2_ + 2,
                                       CONCAT22(uStack_790._2_2_ + uStack_7a0._2_2_ + 2,
                                                (short)uStack_790 + (short)uStack_7a0 + 2)));
        local_3bc = 2;
        auVar21._8_8_ = uStack_3b0;
        auVar21._0_8_ = local_3b8;
        auVar34 = psraw(auVar21,ZEXT416(2));
        local_1208 = auVar34._0_8_;
        uStack_1200 = auVar34._8_8_;
        local_2a8 = local_11e8;
        uStack_2a0 = uStack_11e0;
        local_298._0_2_ = auVar33._0_2_;
        local_298._2_2_ = auVar33._2_2_;
        local_298._4_2_ = auVar33._4_2_;
        local_298._6_2_ = auVar33._6_2_;
        uStack_290._0_2_ = auVar33._8_2_;
        uStack_290._2_2_ = auVar33._10_2_;
        uStack_290._4_2_ = auVar33._12_2_;
        uStack_290._6_2_ = auVar33._14_2_;
        local_1a8 = CONCAT17((0 < uStack_290._6_2_) * (uStack_290._6_2_ < 0x100) * auVar33[0xe] -
                             (0xff < uStack_290._6_2_),
                             CONCAT16((0 < uStack_290._4_2_) * (uStack_290._4_2_ < 0x100) *
                                      auVar33[0xc] - (0xff < uStack_290._4_2_),
                                      CONCAT15((0 < uStack_290._2_2_) * (uStack_290._2_2_ < 0x100) *
                                               auVar33[10] - (0xff < uStack_290._2_2_),
                                               CONCAT14((0 < (short)uStack_290) *
                                                        ((short)uStack_290 < 0x100) * auVar33[8] -
                                                        (0xff < (short)uStack_290),
                                                        CONCAT13((0 < local_298._6_2_) *
                                                                 (local_298._6_2_ < 0x100) *
                                                                 auVar33[6] -
                                                                 (0xff < local_298._6_2_),
                                                                 CONCAT12((0 < local_298._4_2_) *
                                                                          (local_298._4_2_ < 0x100)
                                                                          * auVar33[4] -
                                                                          (0xff < local_298._4_2_),
                                                                          CONCAT11((0 < local_298.
                                                                                        _2_2_) *
                                                                                   (local_298._2_2_
                                                                                   < 0x100) *
                                                                                   auVar33[2] -
                                                                                   (0xff < local_298
                                                  ._2_2_),(0 < (short)local_298) *
                                                          ((short)local_298 < 0x100) * auVar33[0] -
                                                          (0xff < (short)local_298))))))));
        uStack_1a0 = CONCAT17((0 < uStack_290._6_2_) * (uStack_290._6_2_ < 0x100) * auVar33[0xe] -
                              (0xff < uStack_290._6_2_),
                              CONCAT16((0 < uStack_290._4_2_) * (uStack_290._4_2_ < 0x100) *
                                       auVar33[0xc] - (0xff < uStack_290._4_2_),
                                       CONCAT15((0 < uStack_290._2_2_) * (uStack_290._2_2_ < 0x100)
                                                * auVar33[10] - (0xff < uStack_290._2_2_),
                                                CONCAT14((0 < (short)uStack_290) *
                                                         ((short)uStack_290 < 0x100) * auVar33[8] -
                                                         (0xff < (short)uStack_290),
                                                         CONCAT13((0 < local_298._6_2_) *
                                                                  (local_298._6_2_ < 0x100) *
                                                                  auVar33[6] -
                                                                  (0xff < local_298._6_2_),
                                                                  CONCAT12((0 < local_298._4_2_) *
                                                                           (local_298._4_2_ < 0x100)
                                                                           * auVar33[4] -
                                                                           (0xff < local_298._4_2_),
                                                                           CONCAT11((0 < local_298.
                                                                                         _2_2_) *
                                                                                    (local_298._2_2_
                                                                                    < 0x100) *
                                                                                    auVar33[2] -
                                                                                    (0xff < 
                                                  local_298._2_2_),
                                                  (0 < (short)local_298) *
                                                  ((short)local_298 < 0x100) * auVar33[0] -
                                                  (0xff < (short)local_298))))))));
        local_2c8 = local_1208;
        uStack_2c0 = uStack_1200;
        local_2b8._0_2_ = auVar34._0_2_;
        local_2b8._2_2_ = auVar34._2_2_;
        local_2b8._4_2_ = auVar34._4_2_;
        local_2b8._6_2_ = auVar34._6_2_;
        uStack_2b0._0_2_ = auVar34._8_2_;
        uStack_2b0._2_2_ = auVar34._10_2_;
        uStack_2b0._4_2_ = auVar34._12_2_;
        uStack_2b0._6_2_ = auVar34._14_2_;
        local_1c8 = CONCAT17((0 < uStack_2b0._6_2_) * (uStack_2b0._6_2_ < 0x100) * auVar34[0xe] -
                             (0xff < uStack_2b0._6_2_),
                             CONCAT16((0 < uStack_2b0._4_2_) * (uStack_2b0._4_2_ < 0x100) *
                                      auVar34[0xc] - (0xff < uStack_2b0._4_2_),
                                      CONCAT15((0 < uStack_2b0._2_2_) * (uStack_2b0._2_2_ < 0x100) *
                                               auVar34[10] - (0xff < uStack_2b0._2_2_),
                                               CONCAT14((0 < (short)uStack_2b0) *
                                                        ((short)uStack_2b0 < 0x100) * auVar34[8] -
                                                        (0xff < (short)uStack_2b0),
                                                        CONCAT13((0 < local_2b8._6_2_) *
                                                                 (local_2b8._6_2_ < 0x100) *
                                                                 auVar34[6] -
                                                                 (0xff < local_2b8._6_2_),
                                                                 CONCAT12((0 < local_2b8._4_2_) *
                                                                          (local_2b8._4_2_ < 0x100)
                                                                          * auVar34[4] -
                                                                          (0xff < local_2b8._4_2_),
                                                                          CONCAT11((0 < local_2b8.
                                                                                        _2_2_) *
                                                                                   (local_2b8._2_2_
                                                                                   < 0x100) *
                                                                                   auVar34[2] -
                                                                                   (0xff < local_2b8
                                                  ._2_2_),(0 < (short)local_2b8) *
                                                          ((short)local_2b8 < 0x100) * auVar34[0] -
                                                          (0xff < (short)local_2b8))))))));
        uStack_1c0 = CONCAT17((0 < uStack_2b0._6_2_) * (uStack_2b0._6_2_ < 0x100) * auVar34[0xe] -
                              (0xff < uStack_2b0._6_2_),
                              CONCAT16((0 < uStack_2b0._4_2_) * (uStack_2b0._4_2_ < 0x100) *
                                       auVar34[0xc] - (0xff < uStack_2b0._4_2_),
                                       CONCAT15((0 < uStack_2b0._2_2_) * (uStack_2b0._2_2_ < 0x100)
                                                * auVar34[10] - (0xff < uStack_2b0._2_2_),
                                                CONCAT14((0 < (short)uStack_2b0) *
                                                         ((short)uStack_2b0 < 0x100) * auVar34[8] -
                                                         (0xff < (short)uStack_2b0),
                                                         CONCAT13((0 < local_2b8._6_2_) *
                                                                  (local_2b8._6_2_ < 0x100) *
                                                                  auVar34[6] -
                                                                  (0xff < local_2b8._6_2_),
                                                                  CONCAT12((0 < local_2b8._4_2_) *
                                                                           (local_2b8._4_2_ < 0x100)
                                                                           * auVar34[4] -
                                                                           (0xff < local_2b8._4_2_),
                                                                           CONCAT11((0 < local_2b8.
                                                                                         _2_2_) *
                                                                                    (local_2b8._2_2_
                                                                                    < 0x100) *
                                                                                    auVar34[2] -
                                                                                    (0xff < 
                                                  local_2b8._2_2_),
                                                  (0 < (short)local_2b8) *
                                                  ((short)local_2b8 < 0x100) * auVar34[0] -
                                                  (0xff < (short)local_2b8))))))));
        local_190 = local_ba8;
        *local_ba8 = local_1a8;
        local_1b0 = local_bb0;
        *local_bb0 = local_1c8;
        local_ba8 = local_ba8 + 1;
        local_bb0 = local_bb0 + 1;
        local_b98 = local_b98 + 1;
        local_ba0 = local_ba0 + 1;
        local_7e8 = local_e8;
        uStack_7e0 = uStack_e0;
        local_7c8 = local_e8;
        uStack_7c0 = uStack_e0;
        local_7a8 = local_11b8;
        uStack_7a0 = uStack_11b0;
        local_798 = local_11a8;
        uStack_790 = uStack_11a0;
        local_788 = local_1188;
        uStack_780 = uStack_1180;
        local_778 = local_1178;
        uStack_770 = uStack_1170;
        local_5a8 = local_108;
        uStack_5a0 = uStack_100;
        local_588 = local_128;
        uStack_580 = uStack_120;
        local_568 = local_148;
        uStack_560 = uStack_140;
        local_558 = local_598;
        uStack_550 = uStack_590;
        local_548 = local_168;
        uStack_540 = uStack_160;
        local_538 = local_578;
        uStack_530 = uStack_570;
        local_2b8 = local_1208;
        uStack_2b0 = uStack_1200;
        local_298 = local_11e8;
        uStack_290 = uStack_11e0;
      }
      for (; local_bb4 < local_990; local_bb4 = local_bb4 + 1) {
        sVar1 = *(short *)*local_b98;
        sVar2 = *(short *)*local_ba0;
        *(char *)local_ba8 =
             (char)((int)(short)((uint)((int)local_90a * (int)sVar1) >> 0x10) +
                    (int)(short)((uint)((int)local_90c * (int)sVar2) >> 0x10) + 2 >> 2);
        *(char *)local_bb0 =
             (char)((int)(short)((uint)((int)local_90e * (int)sVar1) >> 0x10) +
                    (int)(short)((uint)((int)local_910 * (int)sVar2) >> 0x10) + 2 >> 2);
        local_bb0 = (undefined8 *)((long)local_bb0 + 1);
        local_ba8 = (undefined8 *)((long)local_ba8 + 1);
        local_ba0 = (undefined1 (*) [16])(*local_ba0 + 2);
        local_b98 = (undefined1 (*) [16])(*local_b98 + 2);
      }
      local_9c8 = local_9c8 + 4;
      local_ae4 = local_ae4 + 1;
      local_158 = local_90a;
      local_156 = local_90a;
      local_154 = local_90a;
      local_152 = local_90a;
      local_150 = local_90a;
      local_14e = local_90a;
      local_14c = local_90a;
      local_14a = local_90a;
      local_138 = local_90c;
      local_136 = local_90c;
      local_134 = local_90c;
      local_132 = local_90c;
      local_130 = local_90c;
      local_12e = local_90c;
      local_12c = local_90c;
      local_12a = local_90c;
      local_118 = local_90e;
      local_116 = local_90e;
      local_114 = local_90e;
      local_112 = local_90e;
      local_110 = local_90e;
      local_10e = local_90e;
      local_10c = local_90e;
      local_10a = local_90e;
      local_f8 = local_910;
      local_f6 = local_910;
      local_f4 = local_910;
      local_f2 = local_910;
      local_f0 = local_910;
      local_ee = local_910;
      local_ec = local_910;
      local_ea = local_910;
    }
    else {
      local_914 = *local_9c8;
      local_916 = local_9c8[1];
      local_d18 = local_ac8;
      local_d20 = local_ad0;
      local_d28 = (undefined8 *)(local_978 + local_990 * local_ae4);
      local_c8 = CONCAT26(local_914,CONCAT24(local_914,CONCAT22(local_914,local_914)));
      uStack_c0 = CONCAT26(local_914,CONCAT24(local_914,CONCAT22(local_914,local_914)));
      local_a8 = CONCAT26(local_916,CONCAT24(local_916,CONCAT22(local_916,local_916)));
      uStack_a0 = CONCAT26(local_916,CONCAT24(local_916,CONCAT22(local_916,local_916)));
      local_918 = 2;
      local_62 = 2;
      local_64 = 2;
      local_66 = 2;
      local_68 = 2;
      local_6a = 2;
      local_6c = 2;
      local_6e = 2;
      local_70 = 2;
      local_88 = 0x2000200020002;
      uStack_80 = 0x2000200020002;
      for (local_d2c = 0; local_d2c + 0xf < local_990; local_d2c = local_d2c + 0x10) {
        local_8e0 = local_d18;
        local_5b8 = *(undefined8 *)*local_d18;
        uStack_5b0 = *(undefined8 *)(*local_d18 + 8);
        local_8e8 = local_d18 + 1;
        local_5f8 = *(undefined8 *)*local_8e8;
        uStack_5f0 = *(undefined8 *)(local_d18[1] + 8);
        local_8f0 = local_d20;
        local_5d8 = *(undefined8 *)*local_d20;
        uStack_5d0 = *(undefined8 *)(*local_d20 + 8);
        local_8f8 = local_d20 + 1;
        local_618 = *(undefined8 *)*local_8f8;
        uStack_610 = *(undefined8 *)(local_d20[1] + 8);
        auVar5._8_8_ = uStack_c0;
        auVar5._0_8_ = local_c8;
        auVar33 = pmulhw(*local_d18,auVar5);
        auVar36._8_8_ = uStack_a0;
        auVar36._0_8_ = local_a8;
        auVar34 = pmulhw(*local_d20,auVar36);
        local_12e8 = auVar34._0_8_;
        uStack_12e0 = auVar34._8_8_;
        local_12d8 = auVar33._0_8_;
        uStack_12d0 = auVar33._8_8_;
        local_7f8._0_2_ = auVar33._0_2_;
        local_7f8._2_2_ = auVar33._2_2_;
        local_7f8._4_2_ = auVar33._4_2_;
        local_7f8._6_2_ = auVar33._6_2_;
        uStack_7f0._0_2_ = auVar33._8_2_;
        uStack_7f0._2_2_ = auVar33._10_2_;
        uStack_7f0._4_2_ = auVar33._12_2_;
        uStack_7f0._6_2_ = auVar33._14_2_;
        local_808._0_2_ = auVar34._0_2_;
        local_808._2_2_ = auVar34._2_2_;
        local_808._4_2_ = auVar34._4_2_;
        local_808._6_2_ = auVar34._6_2_;
        uStack_800._0_2_ = auVar34._8_2_;
        uStack_800._2_2_ = auVar34._10_2_;
        uStack_800._4_2_ = auVar34._12_2_;
        uStack_800._6_2_ = auVar34._14_2_;
        local_838 = CONCAT26(local_7f8._6_2_ + local_808._6_2_,
                             CONCAT24(local_7f8._4_2_ + local_808._4_2_,
                                      CONCAT22(local_7f8._2_2_ + local_808._2_2_,
                                               (short)local_7f8 + (short)local_808)));
        uStack_830 = CONCAT26(uStack_7f0._6_2_ + uStack_800._6_2_,
                              CONCAT24(uStack_7f0._4_2_ + uStack_800._4_2_,
                                       CONCAT22(uStack_7f0._2_2_ + uStack_800._2_2_,
                                                (short)uStack_7f0 + (short)uStack_800)));
        auVar35._8_8_ = uStack_c0;
        auVar35._0_8_ = local_c8;
        auVar33 = pmulhw(*local_8e8,auVar35);
        auVar34._8_8_ = uStack_a0;
        auVar34._0_8_ = local_a8;
        auVar34 = pmulhw(*local_8f8,auVar34);
        local_1318 = auVar34._0_8_;
        uStack_1310 = auVar34._8_8_;
        local_1308 = auVar33._0_8_;
        uStack_1300 = auVar33._8_8_;
        local_818._0_2_ = auVar33._0_2_;
        local_818._2_2_ = auVar33._2_2_;
        local_818._4_2_ = auVar33._4_2_;
        local_818._6_2_ = auVar33._6_2_;
        uStack_810._0_2_ = auVar33._8_2_;
        uStack_810._2_2_ = auVar33._10_2_;
        uStack_810._4_2_ = auVar33._12_2_;
        uStack_810._6_2_ = auVar33._14_2_;
        local_828._0_2_ = auVar34._0_2_;
        local_828._2_2_ = auVar34._2_2_;
        local_828._4_2_ = auVar34._4_2_;
        local_828._6_2_ = auVar34._6_2_;
        uStack_820._0_2_ = auVar34._8_2_;
        uStack_820._2_2_ = auVar34._10_2_;
        uStack_820._4_2_ = auVar34._12_2_;
        uStack_820._6_2_ = auVar34._14_2_;
        local_858 = CONCAT26(local_818._6_2_ + local_828._6_2_,
                             CONCAT24(local_818._4_2_ + local_828._4_2_,
                                      CONCAT22(local_818._2_2_ + local_828._2_2_,
                                               (short)local_818 + (short)local_828)));
        uStack_850 = CONCAT26(uStack_810._6_2_ + uStack_820._6_2_,
                              CONCAT24(uStack_810._4_2_ + uStack_820._4_2_,
                                       CONCAT22(uStack_810._2_2_ + uStack_820._2_2_,
                                                (short)uStack_810 + (short)uStack_820)));
        local_3d8 = CONCAT26(local_7f8._6_2_ + local_808._6_2_ + 2,
                             CONCAT24(local_7f8._4_2_ + local_808._4_2_ + 2,
                                      CONCAT22(local_7f8._2_2_ + local_808._2_2_ + 2,
                                               (short)local_7f8 + (short)local_808 + 2)));
        uStack_3d0 = CONCAT26(uStack_7f0._6_2_ + uStack_800._6_2_ + 2,
                              CONCAT24(uStack_7f0._4_2_ + uStack_800._4_2_ + 2,
                                       CONCAT22(uStack_7f0._2_2_ + uStack_800._2_2_ + 2,
                                                (short)uStack_7f0 + (short)uStack_800 + 2)));
        local_3dc = 2;
        auVar20._8_8_ = uStack_3d0;
        auVar20._0_8_ = local_3d8;
        auVar33 = psraw(auVar20,ZEXT416(2));
        local_1348 = auVar33._0_8_;
        uStack_1340 = auVar33._8_8_;
        local_3f8 = CONCAT26(local_818._6_2_ + local_828._6_2_ + 2,
                             CONCAT24(local_818._4_2_ + local_828._4_2_ + 2,
                                      CONCAT22(local_818._2_2_ + local_828._2_2_ + 2,
                                               (short)local_818 + (short)local_828 + 2)));
        uStack_3f0 = CONCAT26(uStack_810._6_2_ + uStack_820._6_2_ + 2,
                              CONCAT24(uStack_810._4_2_ + uStack_820._4_2_ + 2,
                                       CONCAT22(uStack_810._2_2_ + uStack_820._2_2_ + 2,
                                                (short)uStack_810 + (short)uStack_820 + 2)));
        local_3fc = 2;
        auVar19._8_8_ = uStack_3f0;
        auVar19._0_8_ = local_3f8;
        auVar34 = psraw(auVar19,ZEXT416(2));
        local_1368 = auVar34._0_8_;
        uStack_1360 = auVar34._8_8_;
        local_2d8._0_2_ = auVar33._0_2_;
        local_2d8._2_2_ = auVar33._2_2_;
        local_2d8._4_2_ = auVar33._4_2_;
        local_2d8._6_2_ = auVar33._6_2_;
        uStack_2d0._0_2_ = auVar33._8_2_;
        uStack_2d0._2_2_ = auVar33._10_2_;
        uStack_2d0._4_2_ = auVar33._12_2_;
        uStack_2d0._6_2_ = auVar33._14_2_;
        local_2e8._0_2_ = auVar34._0_2_;
        local_2e8._2_2_ = auVar34._2_2_;
        local_2e8._4_2_ = auVar34._4_2_;
        local_2e8._6_2_ = auVar34._6_2_;
        uStack_2e0._0_2_ = auVar34._8_2_;
        uStack_2e0._2_2_ = auVar34._10_2_;
        uStack_2e0._4_2_ = auVar34._12_2_;
        uStack_2e0._6_2_ = auVar34._14_2_;
        local_248 = CONCAT17((0 < uStack_2d0._6_2_) * (uStack_2d0._6_2_ < 0x100) * auVar33[0xe] -
                             (0xff < uStack_2d0._6_2_),
                             CONCAT16((0 < uStack_2d0._4_2_) * (uStack_2d0._4_2_ < 0x100) *
                                      auVar33[0xc] - (0xff < uStack_2d0._4_2_),
                                      CONCAT15((0 < uStack_2d0._2_2_) * (uStack_2d0._2_2_ < 0x100) *
                                               auVar33[10] - (0xff < uStack_2d0._2_2_),
                                               CONCAT14((0 < (short)uStack_2d0) *
                                                        ((short)uStack_2d0 < 0x100) * auVar33[8] -
                                                        (0xff < (short)uStack_2d0),
                                                        CONCAT13((0 < local_2d8._6_2_) *
                                                                 (local_2d8._6_2_ < 0x100) *
                                                                 auVar33[6] -
                                                                 (0xff < local_2d8._6_2_),
                                                                 CONCAT12((0 < local_2d8._4_2_) *
                                                                          (local_2d8._4_2_ < 0x100)
                                                                          * auVar33[4] -
                                                                          (0xff < local_2d8._4_2_),
                                                                          CONCAT11((0 < local_2d8.
                                                                                        _2_2_) *
                                                                                   (local_2d8._2_2_
                                                                                   < 0x100) *
                                                                                   auVar33[2] -
                                                                                   (0xff < local_2d8
                                                  ._2_2_),(0 < (short)local_2d8) *
                                                          ((short)local_2d8 < 0x100) * auVar33[0] -
                                                          (0xff < (short)local_2d8))))))));
        uStack_240 = CONCAT17((0 < uStack_2e0._6_2_) * (uStack_2e0._6_2_ < 0x100) * auVar34[0xe] -
                              (0xff < uStack_2e0._6_2_),
                              CONCAT16((0 < uStack_2e0._4_2_) * (uStack_2e0._4_2_ < 0x100) *
                                       auVar34[0xc] - (0xff < uStack_2e0._4_2_),
                                       CONCAT15((0 < uStack_2e0._2_2_) * (uStack_2e0._2_2_ < 0x100)
                                                * auVar34[10] - (0xff < uStack_2e0._2_2_),
                                                CONCAT14((0 < (short)uStack_2e0) *
                                                         ((short)uStack_2e0 < 0x100) * auVar34[8] -
                                                         (0xff < (short)uStack_2e0),
                                                         CONCAT13((0 < local_2e8._6_2_) *
                                                                  (local_2e8._6_2_ < 0x100) *
                                                                  auVar34[6] -
                                                                  (0xff < local_2e8._6_2_),
                                                                  CONCAT12((0 < local_2e8._4_2_) *
                                                                           (local_2e8._4_2_ < 0x100)
                                                                           * auVar34[4] -
                                                                           (0xff < local_2e8._4_2_),
                                                                           CONCAT11((0 < local_2e8.
                                                                                         _2_2_) *
                                                                                    (local_2e8._2_2_
                                                                                    < 0x100) *
                                                                                    auVar34[2] -
                                                                                    (0xff < 
                                                  local_2e8._2_2_),
                                                  (0 < (short)local_2e8) *
                                                  ((short)local_2e8 < 0x100) * auVar34[0] -
                                                  (0xff < (short)local_2e8))))))));
        local_230 = local_d28;
        *local_d28 = local_248;
        local_d28[1] = uStack_240;
        local_d28 = local_d28 + 2;
        local_d18 = local_d18 + 2;
        local_d20 = local_d20 + 2;
        local_868 = local_88;
        uStack_860 = uStack_80;
        local_848 = local_88;
        uStack_840 = uStack_80;
        local_828 = local_1318;
        uStack_820 = uStack_1310;
        local_818 = local_1308;
        uStack_810 = uStack_1300;
        local_808 = local_12e8;
        uStack_800 = uStack_12e0;
        local_7f8 = local_12d8;
        uStack_7f0 = uStack_12d0;
        local_628 = local_a8;
        uStack_620 = uStack_a0;
        local_608 = local_c8;
        uStack_600 = uStack_c0;
        local_5e8 = local_a8;
        uStack_5e0 = uStack_a0;
        local_5c8 = local_c8;
        uStack_5c0 = uStack_c0;
        local_2e8 = local_1368;
        uStack_2e0 = uStack_1360;
        local_2d8 = local_1348;
        uStack_2d0 = uStack_1340;
      }
      for (; local_d2c + 7 < local_990; local_d2c = local_d2c + 8) {
        local_900 = local_d18;
        local_638 = *(undefined8 *)*local_d18;
        uStack_630 = *(undefined8 *)(*local_d18 + 8);
        local_908 = local_d20;
        local_658 = *(undefined8 *)*local_d20;
        uStack_650 = *(undefined8 *)(*local_d20 + 8);
        auVar4._8_8_ = uStack_c0;
        auVar4._0_8_ = local_c8;
        auVar33 = pmulhw(*local_d18,auVar4);
        auVar3._8_8_ = uStack_a0;
        auVar3._0_8_ = local_a8;
        auVar34 = pmulhw(*local_d20,auVar3);
        local_13b8 = auVar34._0_8_;
        uStack_13b0 = auVar34._8_8_;
        local_13a8 = auVar33._0_8_;
        uStack_13a0 = auVar33._8_8_;
        local_878._0_2_ = auVar33._0_2_;
        local_878._2_2_ = auVar33._2_2_;
        local_878._4_2_ = auVar33._4_2_;
        local_878._6_2_ = auVar33._6_2_;
        uStack_870._0_2_ = auVar33._8_2_;
        uStack_870._2_2_ = auVar33._10_2_;
        uStack_870._4_2_ = auVar33._12_2_;
        uStack_870._6_2_ = auVar33._14_2_;
        local_888._0_2_ = auVar34._0_2_;
        local_888._2_2_ = auVar34._2_2_;
        local_888._4_2_ = auVar34._4_2_;
        local_888._6_2_ = auVar34._6_2_;
        uStack_880._0_2_ = auVar34._8_2_;
        uStack_880._2_2_ = auVar34._10_2_;
        uStack_880._4_2_ = auVar34._12_2_;
        uStack_880._6_2_ = auVar34._14_2_;
        local_898 = CONCAT26(local_878._6_2_ + local_888._6_2_,
                             CONCAT24(local_878._4_2_ + local_888._4_2_,
                                      CONCAT22(local_878._2_2_ + local_888._2_2_,
                                               (short)local_878 + (short)local_888)));
        uStack_890 = CONCAT26(uStack_870._6_2_ + uStack_880._6_2_,
                              CONCAT24(uStack_870._4_2_ + uStack_880._4_2_,
                                       CONCAT22(uStack_870._2_2_ + uStack_880._2_2_,
                                                (short)uStack_870 + (short)uStack_880)));
        local_418 = CONCAT26(local_878._6_2_ + local_888._6_2_ + 2,
                             CONCAT24(local_878._4_2_ + local_888._4_2_ + 2,
                                      CONCAT22(local_878._2_2_ + local_888._2_2_ + 2,
                                               (short)local_878 + (short)local_888 + 2)));
        uStack_410 = CONCAT26(uStack_870._6_2_ + uStack_880._6_2_ + 2,
                              CONCAT24(uStack_870._4_2_ + uStack_880._4_2_ + 2,
                                       CONCAT22(uStack_870._2_2_ + uStack_880._2_2_ + 2,
                                                (short)uStack_870 + (short)uStack_880 + 2)));
        local_41c = 2;
        auVar18._8_8_ = uStack_410;
        auVar18._0_8_ = local_418;
        auVar33 = psraw(auVar18,ZEXT416(2));
        local_13e8 = auVar33._0_8_;
        uStack_13e0 = auVar33._8_8_;
        local_308 = local_13e8;
        uStack_300 = uStack_13e0;
        local_2f8._0_2_ = auVar33._0_2_;
        local_2f8._2_2_ = auVar33._2_2_;
        local_2f8._4_2_ = auVar33._4_2_;
        local_2f8._6_2_ = auVar33._6_2_;
        uStack_2f0._0_2_ = auVar33._8_2_;
        uStack_2f0._2_2_ = auVar33._10_2_;
        uStack_2f0._4_2_ = auVar33._12_2_;
        uStack_2f0._6_2_ = auVar33._14_2_;
        local_1e8 = CONCAT17((0 < uStack_2f0._6_2_) * (uStack_2f0._6_2_ < 0x100) * auVar33[0xe] -
                             (0xff < uStack_2f0._6_2_),
                             CONCAT16((0 < uStack_2f0._4_2_) * (uStack_2f0._4_2_ < 0x100) *
                                      auVar33[0xc] - (0xff < uStack_2f0._4_2_),
                                      CONCAT15((0 < uStack_2f0._2_2_) * (uStack_2f0._2_2_ < 0x100) *
                                               auVar33[10] - (0xff < uStack_2f0._2_2_),
                                               CONCAT14((0 < (short)uStack_2f0) *
                                                        ((short)uStack_2f0 < 0x100) * auVar33[8] -
                                                        (0xff < (short)uStack_2f0),
                                                        CONCAT13((0 < local_2f8._6_2_) *
                                                                 (local_2f8._6_2_ < 0x100) *
                                                                 auVar33[6] -
                                                                 (0xff < local_2f8._6_2_),
                                                                 CONCAT12((0 < local_2f8._4_2_) *
                                                                          (local_2f8._4_2_ < 0x100)
                                                                          * auVar33[4] -
                                                                          (0xff < local_2f8._4_2_),
                                                                          CONCAT11((0 < local_2f8.
                                                                                        _2_2_) *
                                                                                   (local_2f8._2_2_
                                                                                   < 0x100) *
                                                                                   auVar33[2] -
                                                                                   (0xff < local_2f8
                                                  ._2_2_),(0 < (short)local_2f8) *
                                                          ((short)local_2f8 < 0x100) * auVar33[0] -
                                                          (0xff < (short)local_2f8))))))));
        uStack_1e0 = CONCAT17((0 < uStack_2f0._6_2_) * (uStack_2f0._6_2_ < 0x100) * auVar33[0xe] -
                              (0xff < uStack_2f0._6_2_),
                              CONCAT16((0 < uStack_2f0._4_2_) * (uStack_2f0._4_2_ < 0x100) *
                                       auVar33[0xc] - (0xff < uStack_2f0._4_2_),
                                       CONCAT15((0 < uStack_2f0._2_2_) * (uStack_2f0._2_2_ < 0x100)
                                                * auVar33[10] - (0xff < uStack_2f0._2_2_),
                                                CONCAT14((0 < (short)uStack_2f0) *
                                                         ((short)uStack_2f0 < 0x100) * auVar33[8] -
                                                         (0xff < (short)uStack_2f0),
                                                         CONCAT13((0 < local_2f8._6_2_) *
                                                                  (local_2f8._6_2_ < 0x100) *
                                                                  auVar33[6] -
                                                                  (0xff < local_2f8._6_2_),
                                                                  CONCAT12((0 < local_2f8._4_2_) *
                                                                           (local_2f8._4_2_ < 0x100)
                                                                           * auVar33[4] -
                                                                           (0xff < local_2f8._4_2_),
                                                                           CONCAT11((0 < local_2f8.
                                                                                         _2_2_) *
                                                                                    (local_2f8._2_2_
                                                                                    < 0x100) *
                                                                                    auVar33[2] -
                                                                                    (0xff < 
                                                  local_2f8._2_2_),
                                                  (0 < (short)local_2f8) *
                                                  ((short)local_2f8 < 0x100) * auVar33[0] -
                                                  (0xff < (short)local_2f8))))))));
        local_1d0 = local_d28;
        *local_d28 = local_1e8;
        local_d28 = local_d28 + 1;
        local_d18 = local_d18 + 1;
        local_d20 = local_d20 + 1;
        local_8a8 = local_88;
        uStack_8a0 = uStack_80;
        local_888 = local_13b8;
        uStack_880 = uStack_13b0;
        local_878 = local_13a8;
        uStack_870 = uStack_13a0;
        local_668 = local_a8;
        uStack_660 = uStack_a0;
        local_648 = local_c8;
        uStack_640 = uStack_c0;
        local_2f8 = local_13e8;
        uStack_2f0 = uStack_13e0;
      }
      for (; local_d2c < local_990; local_d2c = local_d2c + 1) {
        *(char *)local_d28 =
             (char)((int)(short)((uint)((int)local_914 * (int)*(short *)*local_d18) >> 0x10) +
                    (int)(short)((uint)((int)local_916 * (int)*(short *)*local_d20) >> 0x10) + 2 >>
                   2);
        local_d28 = (undefined8 *)((long)local_d28 + 1);
        local_d20 = (undefined1 (*) [16])(*local_d20 + 2);
        local_d18 = (undefined1 (*) [16])(*local_d18 + 2);
      }
      local_9c8 = local_9c8 + 2;
      local_b8 = local_914;
      local_b6 = local_914;
      local_b4 = local_914;
      local_b2 = local_914;
      local_b0 = local_914;
      local_ae = local_914;
      local_ac = local_914;
      local_aa = local_914;
      local_98 = local_916;
      local_96 = local_916;
      local_94 = local_916;
      local_92 = local_916;
      local_90 = local_916;
      local_8e = local_916;
      local_8c = local_916;
      local_8a = local_916;
    }
    local_ae0 = local_9d8;
  }
  if (local_9a8 != (void *)0x0) {
    operator_delete__(local_9a8);
  }
  ppauVar37 = &local_ab0;
  local_188 = ppauVar37;
  local_28 = ppauVar37;
  if (local_aa8 != (int *)0x0) {
    local_2c = 0xffffffff;
    LOCK();
    local_30 = *local_aa8;
    *local_aa8 = *local_aa8 + -1;
    UNLOCK();
    if (local_30 == 1) {
      if (local_a90 == (long *)0x0) {
        local_20 = local_ab0;
        if (local_ab0 != (undefined1 (*) [16])0x0) {
          free(local_ab0);
        }
      }
      else {
        (**(code **)(*local_a90 + 0x18))(local_a90,local_ab0);
      }
    }
  }
  *ppauVar37 = (undefined1 (*) [16])0x0;
  ppauVar37[2] = (undefined1 (*) [16])0x0;
  *(undefined4 *)(ppauVar37 + 3) = 0;
  *(undefined4 *)(ppauVar37 + 5) = 0;
  *(undefined4 *)((long)ppauVar37 + 0x2c) = 0;
  *(undefined4 *)(ppauVar37 + 6) = 0;
  *(undefined4 *)((long)ppauVar37 + 0x34) = 0;
  *(undefined4 *)(ppauVar37 + 7) = 0;
  ppauVar37[8] = (undefined1 (*) [16])0x0;
  ppauVar37[1] = (undefined1 (*) [16])0x0;
  local_178 = &local_a68;
  if (local_a60 != (int *)0x0) {
    local_4c = 0xffffffff;
    LOCK();
    local_50 = *local_a60;
    *local_a60 = *local_a60 + -1;
    UNLOCK();
    if (local_50 == 1) {
      local_48 = local_178;
      if (local_a48 == (long *)0x0) {
        local_10 = local_a68;
        if (local_a68 != (undefined1 (*) [16])0x0) {
          free(local_a68);
        }
      }
      else {
        (**(code **)(*local_a48 + 0x18))(local_a48,local_a68);
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_font(const unsigned char* font_bitmap, unsigned char* resized_font_bitmap, int fontpixelsize)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    const int srcw = 20;
    const int srch = 40;
    const int w = fontpixelsize;
    const int h = fontpixelsize * 2;

    double scale = (double)srcw / w;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        xofs[dx] = sx;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w, (size_t)2u);
    Mat rowsbuf1(w, (size_t)2u);
    short* rows0 = (short*)rowsbuf0;
    short* rows1 = (short*)rowsbuf1;

    {
        short* rows1p = rows1;
        for (int dx = 0; dx < w; dx++)
        {
            rows1p[dx] = 0;
        }
    }

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = font_bitmap + 10 * (sy + 1);

            if (sy >= srch - 1)
            {
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    rows1p[dx] = 0;
                }
            }
            else
            {
                const short* ialphap = ialpha;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S1p0;
                    unsigned char S1p1;

                    if (sx < 0)
                    {
                        S1p0 = 0;
                        S1p1 = S1[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S1p0 = (S1[9] & 0xf0) >> 4;
                        S1p1 = 0;
                    }
                    else
                    {
                        S1p0 = sx % 2 == 0 ? S1[sx / 2] & 0x0f : (S1[sx / 2] & 0xf0) >> 4;
                        S1p1 = sx % 2 == 0 ? (S1[sx / 2] & 0xf0) >> 4 : S1[sx / 2 + 1] & 0x0f;
                    }
                    rows1p[dx] = (S1p0 * a0 + S1p1 * a1) * 17 >> 4;

                    ialphap += 2;
                }
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = font_bitmap + 10 * (sy);
            const unsigned char* S1 = font_bitmap + 10 * (sy + 1);

            if (sy >= srch - 1)
            {
                const short* ialphap = ialpha;
                short* rows0p = rows0;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S0p0;
                    unsigned char S0p1;

                    if (sx < 0)
                    {
                        S0p0 = 0;
                        S0p1 = S0[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S0p0 = (S0[9] & 0xf0) >> 4;
                        S0p1 = 0;
                    }
                    else
                    {
                        S0p0 = sx % 2 == 0 ? S0[sx / 2] & 0x0f : (S0[sx / 2] & 0xf0) >> 4;
                        S0p1 = sx % 2 == 0 ? (S0[sx / 2] & 0xf0) >> 4 : S0[sx / 2 + 1] & 0x0f;
                    }
                    rows0p[dx] = (S0p0 * a0 + S0p1 * a1) * 17 >> 4;
                    rows1p[dx] = 0;

                    ialphap += 2;
                }
            }
            else
            {
                const short* ialphap = ialpha;
                short* rows0p = rows0;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S0p0;
                    unsigned char S0p1;
                    unsigned char S1p0;
                    unsigned char S1p1;

                    if (sx < 0)
                    {
                        S0p0 = 0;
                        S0p1 = S0[0] & 0x0f;
                        S1p0 = 0;
                        S1p1 = S1[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S0p0 = (S0[9] & 0xf0) >> 4;
                        S0p1 = 0;
                        S1p0 = (S1[9] & 0xf0) >> 4;
                        S1p1 = 0;
                    }
                    else
                    {
                        S0p0 = sx % 2 == 0 ? S0[sx / 2] & 0x0f : (S0[sx / 2] & 0xf0) >> 4;
                        S0p1 = sx % 2 == 0 ? (S0[sx / 2] & 0xf0) >> 4 : S0[sx / 2 + 1] & 0x0f;
                        S1p0 = sx % 2 == 0 ? S1[sx / 2] & 0x0f : (S1[sx / 2] & 0xf0) >> 4;
                        S1p1 = sx % 2 == 0 ? (S1[sx / 2] & 0xf0) >> 4 : S1[sx / 2 + 1] & 0x0f;
                    }
                    rows0p[dx] = (S0p0 * a0 + S0p1 * a1) * 17 >> 4;
                    rows1p[dx] = (S1p0 * a0 + S1p1 * a1) * 17 >> 4;

                    ialphap += 2;
                }
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            short b0 = ibeta[0];
            short b1 = ibeta[1];
            short b2 = ibeta[2];
            short b3 = ibeta[3];

            short* rows0p = rows0;
            short* rows1p = rows1;
            unsigned char* Dp0 = resized_font_bitmap + w * (dy);
            unsigned char* Dp1 = resized_font_bitmap + w * (dy + 1);

            int dx = 0;
#if __ARM_NEON
            int16x8_t _b0 = vdupq_n_s16(b0);
            int16x8_t _b1 = vdupq_n_s16(b1);
            int16x8_t _b2 = vdupq_n_s16(b2);
            int16x8_t _b3 = vdupq_n_s16(b3);
            for (; dx + 15 < w; dx += 16)
            {
                int16x8_t _r00 = vld1q_s16(rows0p);
                int16x8_t _r01 = vld1q_s16(rows0p + 8);
                int16x8_t _r10 = vld1q_s16(rows1p);
                int16x8_t _r11 = vld1q_s16(rows1p + 8);
                int16x8_t _acc00 = vaddq_s16(vqdmulhq_s16(_r00, _b0), vqdmulhq_s16(_r10, _b1));
                int16x8_t _acc01 = vaddq_s16(vqdmulhq_s16(_r01, _b0), vqdmulhq_s16(_r11, _b1));
                int16x8_t _acc10 = vaddq_s16(vqdmulhq_s16(_r00, _b2), vqdmulhq_s16(_r10, _b3));
                int16x8_t _acc11 = vaddq_s16(vqdmulhq_s16(_r01, _b2), vqdmulhq_s16(_r11, _b3));
                uint8x16_t _Dp0 = vcombine_u8(vqrshrun_n_s16(_acc00, 3), vqrshrun_n_s16(_acc01, 3));
                uint8x16_t _Dp1 = vcombine_u8(vqrshrun_n_s16(_acc10, 3), vqrshrun_n_s16(_acc11, 3));
                vst1q_u8(Dp0, _Dp0);
                vst1q_u8(Dp1, _Dp1);
                Dp0 += 16;
                Dp1 += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                int16x8_t _r0 = vld1q_s16(rows0p);
                int16x8_t _r1 = vld1q_s16(rows1p);
                int16x8_t _acc0 = vaddq_s16(vqdmulhq_s16(_r0, _b0), vqdmulhq_s16(_r1, _b1));
                int16x8_t _acc1 = vaddq_s16(vqdmulhq_s16(_r0, _b2), vqdmulhq_s16(_r1, _b3));
                uint8x8_t _Dp0 = vqrshrun_n_s16(_acc0, 3);
                uint8x8_t _Dp1 = vqrshrun_n_s16(_acc1, 3);
                vst1_u8(Dp0, _Dp0);
                vst1_u8(Dp1, _Dp1);
                Dp0 += 8;
                Dp1 += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __ARM_NEON
#if __SSE2__
            __m128i _b0 = _mm_set1_epi16(b0);
            __m128i _b1 = _mm_set1_epi16(b1);
            __m128i _b2 = _mm_set1_epi16(b2);
            __m128i _b3 = _mm_set1_epi16(b3);
            __m128i _v2 = _mm_set1_epi16(2);
            for (; dx + 15 < w; dx += 16)
            {
                __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
                __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
                __m128i _acc00 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
                __m128i _acc01 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
                __m128i _acc10 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b2), _mm_mulhi_epi16(_r10, _b3));
                __m128i _acc11 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b2), _mm_mulhi_epi16(_r11, _b3));
                _acc00 = _mm_srai_epi16(_mm_add_epi16(_acc00, _v2), 2);
                _acc01 = _mm_srai_epi16(_mm_add_epi16(_acc01, _v2), 2);
                _acc10 = _mm_srai_epi16(_mm_add_epi16(_acc10, _v2), 2);
                _acc11 = _mm_srai_epi16(_mm_add_epi16(_acc11, _v2), 2);
                __m128i _Dp0 = _mm_packus_epi16(_acc00, _acc01);
                __m128i _Dp1 = _mm_packus_epi16(_acc10, _acc11);
                _mm_storeu_si128((__m128i*)Dp0, _Dp0);
                _mm_storeu_si128((__m128i*)Dp1, _Dp1);
                Dp0 += 16;
                Dp1 += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
                __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b2), _mm_mulhi_epi16(_r1, _b3));
                _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
                _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
                __m128i _Dp0 = _mm_packus_epi16(_acc0, _acc0);
                __m128i _Dp1 = _mm_packus_epi16(_acc1, _acc1);
                _mm_storel_epi64((__m128i*)Dp0, _Dp0);
                _mm_storel_epi64((__m128i*)Dp1, _Dp1);
                Dp0 += 8;
                Dp1 += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __SSE2__
            for (; dx < w; dx++)
            {
                short s0 = *rows0p++;
                short s1 = *rows1p++;

                *Dp0++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
                *Dp1++ = (unsigned char)(((short)((b2 * s0) >> 16) + (short)((b3 * s1) >> 16) + 2) >> 2);
            }

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            short b0 = ibeta[0];
            short b1 = ibeta[1];

            short* rows0p = rows0;
            short* rows1p = rows1;
            unsigned char* Dp = resized_font_bitmap + w * (dy);

            int dx = 0;
#if __ARM_NEON
            int16x8_t _b0 = vdupq_n_s16(b0);
            int16x8_t _b1 = vdupq_n_s16(b1);
            for (; dx + 15 < w; dx += 16)
            {
                int16x8_t _r00 = vld1q_s16(rows0p);
                int16x8_t _r01 = vld1q_s16(rows0p + 8);
                int16x8_t _r10 = vld1q_s16(rows1p);
                int16x8_t _r11 = vld1q_s16(rows1p + 8);
                int16x8_t _acc0 = vaddq_s16(vqdmulhq_s16(_r00, _b0), vqdmulhq_s16(_r10, _b1));
                int16x8_t _acc1 = vaddq_s16(vqdmulhq_s16(_r01, _b0), vqdmulhq_s16(_r11, _b1));
                uint8x16_t _Dp = vcombine_u8(vqrshrun_n_s16(_acc0, 3), vqrshrun_n_s16(_acc1, 3));
                vst1q_u8(Dp, _Dp);
                Dp += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                int16x8_t _r0 = vld1q_s16(rows0p);
                int16x8_t _r1 = vld1q_s16(rows1p);
                int16x8_t _acc = vaddq_s16(vqdmulhq_s16(_r0, _b0), vqdmulhq_s16(_r1, _b1));
                uint8x8_t _Dp = vqrshrun_n_s16(_acc, 3);
                vst1_u8(Dp, _Dp);
                Dp += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __ARM_NEON
#if __SSE2__
            __m128i _b0 = _mm_set1_epi16(b0);
            __m128i _b1 = _mm_set1_epi16(b1);
            __m128i _v2 = _mm_set1_epi16(2);
            for (; dx + 15 < w; dx += 16)
            {
                __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
                __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
                __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
                __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
                _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
                _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
                __m128i _Dp = _mm_packus_epi16(_acc0, _acc1);
                _mm_storeu_si128((__m128i*)Dp, _Dp);
                Dp += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _acc = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
                _acc = _mm_srai_epi16(_mm_add_epi16(_acc, _v2), 2);
                __m128i _Dp = _mm_packus_epi16(_acc, _acc);
                _mm_storel_epi64((__m128i*)Dp, _Dp);
                Dp += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __SSE2__
            for (; dx < w; dx++)
            {
                short s0 = *rows0p++;
                short s1 = *rows1p++;

                *Dp++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
            }

            ibeta += 2;
        }
    }

    delete[] buf;
}